

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  void *__ptr;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  __ptr = handle->data;
  piVar1 = (int *)((long)__ptr + 0x114);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if ((test_mode == '\x01') && (*(int *)((long)__ptr + 0x110) == 0)) {
    eval_a = *(long *)((long)__ptr + 0x100);
    eval_b = 0;
    if (eval_a != 0) {
      pcVar4 = "0";
      pcVar3 = "context->read";
      uVar2 = 0xb9;
      goto LAB_00165806;
    }
  }
  else {
    eval_a = *(long *)((long)__ptr + 0x100);
    eval_b = 0x10000;
    if (eval_a != 0x10000) {
      pcVar4 = "(1 << 16)";
      pcVar3 = "context->read";
      uVar2 = 0xb7;
      goto LAB_00165806;
    }
    if ((test_mode != '\0') && (*(int *)((long)__ptr + 0x110) != 0)) {
      eval_a = *(long *)((long)__ptr + 0x108);
      eval_b = 0;
      if (eval_a != 0) {
        pcVar4 = "0";
        pcVar3 = "context->sent";
        uVar2 = 0xbf;
        goto LAB_00165806;
      }
      goto LAB_0016575d;
    }
  }
  eval_a = *(long *)((long)__ptr + 0x108);
  eval_b = 0x10000;
  if (eval_a == 0x10000) {
LAB_0016575d:
    closed_connections = closed_connections + 1;
    free(__ptr);
    return;
  }
  pcVar4 = "(1 << 16)";
  pcVar3 = "context->sent";
  uVar2 = 0xbd;
LAB_00165806:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT_EQ(context->read, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->read);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT_EQ(context->sent, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->sent);
    }

    closed_connections++;

    free(context);
  }
}